

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O0

void worker_config_init(worker_config_conflict *wc,int use_broadcast,signal_func signal_f,
                       wait_func wait_f)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  wait_func wait_f_local;
  signal_func signal_f_local;
  int use_broadcast_local;
  worker_config_conflict *wc_local;
  
  memset(wc,0,0xb8);
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;
  iVar1 = uv_sem_init(wc,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x3a,"uv_sem_init(&wc->sem_waiting, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_sem_init(&wc->sem_signaled,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x3b,"uv_sem_init(&wc->sem_signaled, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_cond_init(&wc->cond);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x3c,"uv_cond_init(&wc->cond)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_mutex_init(&wc->mutex);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-condvar.c"
            ,0x3d,"uv_mutex_init(&wc->mutex)","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

void worker_config_init(worker_config* wc,
                        int use_broadcast,
                        signal_func signal_f,
                        wait_func wait_f) {
  /* Wipe. */
  memset(wc, 0, sizeof(*wc));

  /* Copy vars. */
  wc->signal_cond = signal_f;
  wc->wait_cond = wait_f;
  wc->use_broadcast = use_broadcast;

  /* Init. */
  ASSERT_OK(uv_sem_init(&wc->sem_waiting, 0));
  ASSERT_OK(uv_sem_init(&wc->sem_signaled, 0));
  ASSERT_OK(uv_cond_init(&wc->cond));
  ASSERT_OK(uv_mutex_init(&wc->mutex));
}